

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O0

UINT8 AudioDrv_DataForward_Remove(void *drvStruct,void *destDrvStruct)

{
  UINT8 retVal;
  ADRV_INSTANCE *audInstDst;
  ADRV_INSTANCE *audInstSrc;
  void *destDrvStruct_local;
  void *drvStruct_local;
  
  if (destDrvStruct == (void *)0x0) {
    drvStruct_local._7_1_ = 0xff;
  }
  else {
    OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
    drvStruct_local._7_1_ =
         ADrvLst_Remove((ADRV_LIST **)((long)drvStruct + 0x38),(ADRV_INSTANCE *)destDrvStruct);
    if (drvStruct_local._7_1_ == '\0') {
      if ((*(long *)((long)drvStruct + 0x38) == 0) && (*(long *)((long)drvStruct + 8) != 0)) {
        (**(code **)(*(long *)((long)drvStruct + 8) + 0x68))
                  (*(undefined8 *)((long)drvStruct + 0x20),*(undefined8 *)((long)drvStruct + 0x30),
                   *(undefined8 *)((long)drvStruct + 0x28));
      }
      OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
      drvStruct_local._7_1_ = '\0';
    }
    else {
      OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
    }
  }
  return drvStruct_local._7_1_;
}

Assistant:

UINT8 AudioDrv_DataForward_Remove(void* drvStruct, const void* destDrvStruct)
{
	ADRV_INSTANCE* audInstSrc = (ADRV_INSTANCE*)drvStruct;
	ADRV_INSTANCE* audInstDst = (ADRV_INSTANCE*)destDrvStruct;
	UINT8 retVal;
	
	if (audInstDst == NULL)
		return 0xFF;
	OSMutex_Lock(audInstSrc->hMutex);
	retVal = ADrvLst_Remove(&audInstSrc->forwardDrvs, audInstDst);
	if (retVal)
	{
		OSMutex_Unlock(audInstSrc->hMutex);
		return retVal;
	}
	
	// make it call the original callback function
	if (audInstSrc->forwardDrvs == NULL && audInstSrc->drvStruct != NULL)
		audInstSrc->drvStruct->SetCallback(audInstSrc->drvData, audInstSrc->mainCallback, audInstSrc->userParam);
	OSMutex_Unlock(audInstSrc->hMutex);
	return AERR_OK;
}